

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *outChannels;
  string *psVar3;
  uint __val;
  uint uVar4;
  bool bVar5;
  LayerUnion LVar6;
  WeightParams *pWVar7;
  undefined8 *puVar8;
  unsigned_long *puVar9;
  LogMessage *other;
  uint uVar10;
  ulong *puVar11;
  ulong uVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  undefined1 auVar15 [8];
  uint64_t expectedUnits;
  uint uVar16;
  uint __len;
  Result r;
  string err;
  string err_1;
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [24];
  string local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  Result::Result((Result *)&local_138);
  validateInputCount((Result *)local_c8,layer,1,1);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8;
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
  pcVar2 = local_b8 + 8;
  if (local_c0._M_p != pcVar2) {
    operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_138);
  if (bVar5) {
    validateOutputCount((Result *)local_c8,layer,1,1);
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
    if (local_c0._M_p != pcVar2) {
      operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
    }
  }
  bVar5 = Result::good((Result *)&local_138);
  if (bVar5) {
    if (this->ndArrayInterpretation != true) {
LAB_002cd220:
      if (layer->_oneof_case_[0] == 0xfa) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.bias_ = Specification::BiasLayerParams::default_instance();
      }
      pWVar7 = (LVar6.batchnorm_)->variance_;
      if (pWVar7 == (WeightParams *)0x0) {
        pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar5 = 0 < (pWVar7->floatvalue_).current_size_;
      uVar16 = bVar5 + 1;
      if (((pWVar7->float16value_).ptr_)->_M_string_length == 0) {
        uVar16 = (uint)bVar5;
      }
      if (((uVar16 - (((pWVar7->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar7->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        this_00 = &(LVar6.convolution_)->kernelsize_;
        if ((((LVar6.convolution_)->kernelsize_).current_size_ | 2U) == 3) {
          uVar16 = 0;
          if (this_00->current_size_ < 1) {
            expectedUnits = 1;
          }
          else {
            expectedUnits = 1;
            do {
              puVar9 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,uVar16);
              expectedUnits = expectedUnits * *puVar9;
              uVar16 = uVar16 + 1;
            } while ((int)uVar16 < this_00->current_size_);
            uVar16 = (uint)(this_00->current_size_ == 3);
          }
          if (((char)uVar16 == '\0') ||
             (((LVar6.innerproduct_)->bias_->_internal_metadata_).
              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
              .ptr_ < (void *)0x2)) {
            pWVar7 = (LVar6.batchnorm_)->variance_;
            if (pWVar7 == (WeightParams *)0x0) {
              pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_110 = (undefined1  [8])local_100;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Bias","");
            psVar3 = (layer->name_).ptr_;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"bias","");
            validateGeneralWeightParams
                      ((Result *)local_c8,pWVar7,expectedUnits,1,(string *)local_110,psVar3,
                       &local_e8);
            local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8;
            std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
            if (local_c0._M_p != local_b8 + 8) {
              operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            uVar13 = local_100._0_8_;
            _Var14._M_p = (pointer)local_110;
            if (local_110 != (undefined1  [8])local_100) goto LAB_002cd6ca;
          }
          else {
            pWVar7 = (LVar6.batchnorm_)->variance_;
            if (pWVar7 == (WeightParams *)0x0) {
              pWVar7 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            if (((LVar6.convolution_)->kernelsize_).current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              other = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_c8,"CHECK failed: (index) < (current_size_): ")
              ;
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_e8,other);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c8);
            }
            outChannels = ((LVar6.innerproduct_)->bias_->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          .ptr_;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Bias","");
            psVar3 = (layer->name_).ptr_;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bias","");
            validateGeneralWeightParams
                      ((Result *)local_110,pWVar7,expectedUnits,(uint64_t)outChannels,&local_e8,
                       psVar3,&local_90);
            local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110;
            std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
            if (local_108._M_p != local_100 + 8) {
              operator_delete(local_108._M_p,local_100._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            uVar13 = local_e8.field_2._M_allocated_capacity;
            _Var14._M_p = local_e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_002cd6ca:
              operator_delete(_Var14._M_p,uVar13 + 1);
            }
          }
          goto LAB_002cd6d2;
        }
        std::operator+(&local_90,"Bias layer \'",(layer->name_).ptr_);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        paVar1 = &local_e8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_e8.field_2._M_allocated_capacity = *puVar11;
          local_e8.field_2._8_8_ = puVar8[3];
          local_e8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *puVar11;
          local_e8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar16 = this_00->current_size_;
        __val = -uVar16;
        if (0 < (int)uVar16) {
          __val = uVar16;
        }
        __len = 1;
        if (9 < __val) {
          uVar12 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar10 = (uint)uVar12;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_002cd7d1;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_002cd7d1;
            }
            if (uVar10 < 10000) goto LAB_002cd7d1;
            uVar12 = uVar12 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_002cd7d1:
        local_70 = local_60;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_70,(char)__len - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_70),__len,__val);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          uVar13 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_68 + local_e8._M_string_length) {
          uVar12 = 0xf;
          if (local_70 != local_60) {
            uVar12 = local_60[0];
          }
          if (uVar12 < local_68 + local_e8._M_string_length) goto LAB_002cd852;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_70,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
        }
        else {
LAB_002cd852:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_70);
        }
        local_110 = (undefined1  [8])local_100;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_100._0_8_ = *puVar11;
          local_100._8_8_ = puVar8[3];
        }
        else {
          local_100._0_8_ = *puVar11;
          local_110 = (undefined1  [8])*puVar8;
        }
        local_108._M_p = (pointer)puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append(local_110);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_b8._0_8_ = *puVar11;
          local_b8._8_8_ = puVar8[3];
          local_c8 = (undefined1  [8])local_b8;
        }
        else {
          local_b8._0_8_ = *puVar11;
          local_c8 = (undefined1  [8])*puVar8;
        }
        local_c0._M_p = (pointer)puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if (local_110 != (undefined1  [8])local_100) {
          operator_delete((void *)local_110,local_100._0_8_ + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
        uVar12 = local_b8._0_8_;
        auVar15 = local_c8;
        if (local_c8 == (undefined1  [8])local_b8) goto LAB_002cd720;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"Bias product layer \'",(layer->name_).ptr_);
        puVar8 = (undefined8 *)std::__cxx11::string::append(local_c8);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_100._0_8_ = *puVar11;
          local_100._8_8_ = puVar8[3];
          local_110 = (undefined1  [8])local_100;
        }
        else {
          local_100._0_8_ = *puVar11;
          local_110 = (undefined1  [8])*puVar8;
        }
        local_108._M_p = (pointer)puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if (local_c8 != (undefined1  [8])local_b8) {
          operator_delete((void *)local_c8,local_b8._0_8_ + 1);
        }
        Result::Result((Result *)local_c8,INVALID_MODEL_PARAMETERS,(string *)local_110);
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8;
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
        if (local_c0._M_p != pcVar2) {
          operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_138;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p == &local_120) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_120._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_130._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_128;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        uVar12 = local_100._0_8_;
        auVar15 = local_110;
        local_130._M_p = (pointer)&local_120;
        if (local_110 == (undefined1  [8])local_100) goto LAB_002cd720;
      }
      operator_delete((void *)auVar15,uVar12 + 1);
      goto LAB_002cd720;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Bias","");
    validateInputOutputRankEquality((Result *)local_c8,layer,&local_50,&this->blobNameToRank);
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
    if (local_c0._M_p != pcVar2) {
      operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)&local_138);
    if (bVar5) {
      local_110 = (undefined1  [8])local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Bias","");
      validateRankCount((Result *)local_c8,layer,(string *)local_110,3,-1,&this->blobNameToRank);
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8;
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
      if (local_c0._M_p != pcVar2) {
        operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
      }
      if (local_110 != (undefined1  [8])local_100) {
        operator_delete((void *)local_110,local_100._0_8_ + 1);
      }
      bVar5 = Result::good((Result *)&local_138);
      if (bVar5) goto LAB_002cd220;
    }
  }
LAB_002cd6d2:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_138;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p == &local_120) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_120._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_130._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_128;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_130._M_p = (pointer)&local_120;
LAB_002cd720:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,
                    CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Bias", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Bias", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias");
    } else {
        r = validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias");
    }

    return r;
}